

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

bool __thiscall
QGraphicsScenePrivate::sendEvent(QGraphicsScenePrivate *this,QGraphicsItem *item,QEvent *event)

{
  bool bVar1;
  byte bVar2;
  QGraphicsScenePrivate *this_00;
  QApplicationPrivate *pQVar3;
  QGraphicsObject *pQVar4;
  ulong uVar5;
  QEvent *in_RDX;
  QGraphicsObject *in_RSI;
  QGestureManager *in_RDI;
  bool spont;
  QGraphicsObject *o;
  QGestureManager *gestureManager;
  QGraphicsObject *object;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  QGraphicsScenePrivate *in_stack_ffffffffffffffc8;
  QGestureManager *in_stack_ffffffffffffffd0;
  QGestureManager *this_01;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  this_01 = in_RDI;
  this_00 = (QGraphicsScenePrivate *)
            QGraphicsItem::toGraphicsObject
                      ((QGraphicsItem *)
                       CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  if (this_00 != (QGraphicsScenePrivate *)0x0) {
    pQVar3 = QApplicationPrivate::instance();
    in_stack_ffffffffffffffd0 = pQVar3->gestureManager;
    if ((in_stack_ffffffffffffffd0 != (QGestureManager *)0x0) &&
       (bVar1 = QGestureManager::filterEvent(this_01,in_RSI,in_RDX), bVar1)) {
      return true;
    }
  }
  bVar1 = filterEvent(this_00,(QGraphicsItem *)
                              CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                      (QEvent *)in_stack_ffffffffffffffd0);
  if (bVar1) {
    return false;
  }
  bVar1 = filterDescendantEvent
                    (in_stack_ffffffffffffffc8,
                     (QGraphicsItem *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                     (QEvent *)in_RDI);
  if (!bVar1) {
    if ((in_RSI != (QGraphicsObject *)0x0) &&
       (bVar1 = QGraphicsItem::isEnabled((QGraphicsItem *)0x9c60c0), bVar1)) {
      pQVar4 = QGraphicsItem::toGraphicsObject
                         ((QGraphicsItem *)
                          CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      if (pQVar4 != (QGraphicsObject *)0x0) {
        bVar2 = QEvent::spontaneous(in_RDX);
        if ((bool)bVar2) {
          bVar1 = qt_sendSpontaneousEvent
                            ((QObject *)CONCAT17(bVar2,in_stack_ffffffffffffffc0),(QEvent *)in_RDI);
          if (bVar1) {
            return true;
          }
        }
        else {
          uVar5 = QCoreApplication::sendEvent(&pQVar4->super_QObject,in_RDX);
          if ((uVar5 & 1) != 0) {
            return true;
          }
        }
        in_RDX[0xb] = (QEvent)(bVar2 & 1);
      }
      bVar2 = (**(code **)(*(long *)in_RSI + 0x68))(in_RSI,in_RDX);
      return (bool)(bVar2 & 1);
    }
    return false;
  }
  return false;
}

Assistant:

bool QGraphicsScenePrivate::sendEvent(QGraphicsItem *item, QEvent *event)
{
#if QT_CONFIG(gestures)
    if (QGraphicsObject *object = item->toGraphicsObject()) {
        QGestureManager *gestureManager = QApplicationPrivate::instance()->gestureManager;
        if (gestureManager) {
            if (gestureManager->filterEvent(object, event))
                return true;
        }
    }
#endif // QT_CONFIG(gestures)

    if (filterEvent(item, event))
        return false;
    if (filterDescendantEvent(item, event))
        return false;
    if (!item || !item->isEnabled())
        return false;
    if (QGraphicsObject *o = item->toGraphicsObject()) {
        bool spont = event->spontaneous();
        if (spont ? qt_sendSpontaneousEvent(o, event) : QCoreApplication::sendEvent(o, event))
            return true;
        event->m_spont = spont;
    }
    return item->sceneEvent(event);
}